

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_debug_scaling_list
               (bs_t *b,int *scalingList,int sizeOfScalingList,int *useDefaultScalingMatrixFlag)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  FILE *pFVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar5 = 0;
  uVar7 = (ulong)(uint)sizeOfScalingList;
  if (sizeOfScalingList < 1) {
    uVar7 = uVar5;
  }
  uVar3 = 8;
  uVar4 = 8;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    if ((int)uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      pFVar6 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar6 = _stdout;
      }
      fprintf(pFVar6,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar2 = bs_read_se(b);
      pFVar6 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar6 = _stdout;
      }
      fprintf(pFVar6,"delta_scale: %d \n",(ulong)uVar2);
      uVar1 = (long)(int)(uVar2 + (int)uVar4 + 0x100) % 0x100;
      uVar3 = uVar1 & 0xffffffff;
      bVar8 = (int)uVar1 == 0;
      if (!bVar8) {
        uVar4 = uVar1 & 0xffffffff;
      }
      *useDefaultScalingMatrixFlag = (uint)(bVar8 && uVar5 == 0);
    }
    scalingList[uVar5] = (int)uVar4;
  }
  return;
}

Assistant:

void read_debug_scaling_list(bs_t* b, int* scalingList, int sizeOfScalingList, int* useDefaultScalingMatrixFlag )
{
    // NOTE need to be able to set useDefaultScalingMatrixFlag when reading, hence passing as pointer
    int lastScale = 8;
    int nextScale = 8;
    int delta_scale;
    for( int j = 0; j < sizeOfScalingList; j++ )
    {
        if( nextScale != 0 )
        {
            if( 0 )
            {
                nextScale = scalingList[ j ];
                if (useDefaultScalingMatrixFlag[0]) { nextScale = 0; }
                delta_scale = (nextScale - lastScale) % 256 ;
            }

            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); delta_scale = bs_read_se(b); printf("delta_scale: %d \n", delta_scale); 

            if( 1 )
            {
                nextScale = ( lastScale + delta_scale + 256 ) % 256;
                useDefaultScalingMatrixFlag[0] = ( j == 0 && nextScale == 0 );
            }
        }
        if( 1 )
        {
            scalingList[ j ] = ( nextScale == 0 ) ? lastScale : nextScale;
        }
        lastScale = scalingList[ j ];
    }
}